

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManDupAppend(Gia_Man_t *pNew,Gia_Man_t *pTwo)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  long lVar8;
  long lVar9;
  
  if (0 < pNew->nRegs) {
    pNew->nRegs = 0;
  }
  if (pNew->pHTable == (int *)0x0) {
    Gia_ManHashStart(pNew);
  }
  pTwo->pObjs->Value = 0;
  if (1 < pTwo->nObjs) {
    lVar8 = 1;
    lVar9 = 0x14;
    do {
      pGVar2 = pTwo->pObjs;
      uVar3 = *(ulong *)((long)pGVar2 + lVar9 + -8);
      uVar5 = (uint)uVar3;
      iVar6 = (int)(uVar3 & 0x1fffffff);
      if ((uVar3 & 0x1fffffff) == 0x1fffffff || (int)uVar5 < 0) {
        if ((uVar5 & 0x9fffffff) == 0x9fffffff) {
          pGVar7 = Gia_ManAppendObj(pNew);
          uVar3 = *(ulong *)pGVar7;
          *(ulong *)pGVar7 = uVar3 | 0x9fffffff;
          *(ulong *)pGVar7 =
               uVar3 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = pNew->pObjs;
          if ((pGVar7 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar7)) {
LAB_00672737:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = pNew->pObjs;
          if ((pGVar7 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar7)) goto LAB_00672737;
          iVar6 = (int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * 0x55555556;
          goto LAB_006726f0;
        }
        if ((int)uVar5 < 0 && iVar6 != 0x1fffffff) {
          uVar1 = *(uint *)((long)pGVar2 + lVar9 + (ulong)(uint)(iVar6 << 2) * -3);
          if ((int)uVar1 < 0) goto LAB_00672718;
          iVar6 = Gia_ManAppendCo(pNew,uVar1 ^ uVar5 >> 0x1d & 1);
          goto LAB_006726f0;
        }
      }
      else {
        uVar5 = *(uint *)((long)pGVar2 + lVar9 + (ulong)(uint)(iVar6 << 2) * -3);
        if (((int)uVar5 < 0) ||
           (uVar1 = *(uint *)((long)pGVar2 +
                             lVar9 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) {
LAB_00672718:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10f,"int Abc_LitNotCond(int, int)");
        }
        iVar6 = Gia_ManAppendAnd(pNew,uVar5 ^ (uint)(uVar3 >> 0x1d) & 1,
                                 uVar1 ^ (uint)(uVar3 >> 0x3d) & 1);
LAB_006726f0:
        *(int *)(&pGVar2->field_0x0 + lVar9) = iVar6;
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0xc;
    } while (lVar8 < pTwo->nObjs);
  }
  return;
}

Assistant:

void Gia_ManDupAppend( Gia_Man_t * pNew, Gia_Man_t * pTwo )
{
    Gia_Obj_t * pObj;
    int i;
    if ( pNew->nRegs > 0 )
        pNew->nRegs = 0;
    if ( pNew->pHTable == NULL )
        Gia_ManHashStart( pNew );
    Gia_ManConst0(pTwo)->Value = 0;
    Gia_ManForEachObj1( pTwo, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
}